

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

completion * __thiscall
mjs::interpreter::impl::operator()(completion *__return_storage_ptr__,impl *this,if_statement *s)

{
  bool bVar1;
  statement *s_00;
  value vStack_78;
  value local_50;
  
  eval(&local_50,this,
       (s->cond_)._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
       ._M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
       super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
  get_value(&vStack_78,this,&local_50);
  bVar1 = to_boolean(&vStack_78);
  value::destroy(&vStack_78);
  value::destroy(&local_50);
  if (bVar1) {
    s_00 = (s->if_s_)._M_t.
           super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
           super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
           super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
  }
  else {
    s_00 = (s->else_s_)._M_t.
           super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
           super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
           super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
    if (s_00 == (statement *)0x0) {
      completion::completion(__return_storage_ptr__,(value *)&value::undefined,normal);
      return __return_storage_ptr__;
    }
  }
  eval(__return_storage_ptr__,this,s_00);
  return __return_storage_ptr__;
}

Assistant:

completion operator()(const if_statement& s) {
        if (to_boolean(get_value(eval(s.cond())))) {
            return eval(s.if_s());
        } else if (auto e = s.else_s()) {
            return eval(*e);
        }
        return completion{};
    }